

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

WasmRegisterSpace * __thiscall
Wasm::WasmBytecodeGenerator::GetRegisterSpace(WasmBytecodeGenerator *this,WasmType type)

{
  WasmCompilationException *this_00;
  WasmType type_local;
  WasmBytecodeGenerator *this_local;
  
  switch(type) {
  case FirstLocalType:
    this_local = (WasmBytecodeGenerator *)
                 WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&this->mTypedRegisterAllocator,INT32);
    break;
  case I64:
  case Ptr:
    this_local = (WasmBytecodeGenerator *)
                 WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&this->mTypedRegisterAllocator,INT64);
    break;
  case F32:
    this_local = (WasmBytecodeGenerator *)
                 WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&this->mTypedRegisterAllocator,FLOAT32);
    break;
  case F64:
    this_local = (WasmBytecodeGenerator *)
                 WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&this->mTypedRegisterAllocator,FLOAT64);
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    this_local = (WasmBytecodeGenerator *)
                 WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&this->mTypedRegisterAllocator,SIMD);
    break;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_00,L"Unknown type %u",(ulong)type);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return (WasmRegisterSpace *)this_local;
}

Assistant:

WasmRegisterSpace* WasmBytecodeGenerator::GetRegisterSpace(WasmTypes::WasmType type)
{
    switch (type)
    {
#if TARGET_32
    case WasmTypes::Ptr:
#endif
    case WasmTypes::I32: return mTypedRegisterAllocator.GetRegisterSpace(WAsmJs::INT32);
#if TARGET_64
    case WasmTypes::Ptr:
#endif
    case WasmTypes::I64:    return mTypedRegisterAllocator.GetRegisterSpace(WAsmJs::INT64);
    case WasmTypes::F32:    return mTypedRegisterAllocator.GetRegisterSpace(WAsmJs::FLOAT32);
    case WasmTypes::F64:    return mTypedRegisterAllocator.GetRegisterSpace(WAsmJs::FLOAT64);
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        return mTypedRegisterAllocator.GetRegisterSpace(WAsmJs::SIMD);
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown type %u"), type);
    }
}